

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctaes.c
# Opt level: O3

void AES_decrypt(uchar *in,uchar *out,AES_KEY *key)

{
  char cVar1;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  undefined1 auVar15 [16];
  undefined1 auVar16 [14];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int b;
  int iVar19;
  uchar *in_RCX;
  int iVar20;
  uchar *puVar21;
  long lVar22;
  uchar *puVar23;
  byte bVar24;
  short sVar25;
  byte bVar40;
  ushort uVar41;
  byte bVar42;
  ushort uVar43;
  undefined4 uVar44;
  byte bVar45;
  ushort uVar47;
  ushort uVar49;
  ushort uVar51;
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  ushort uVar46;
  ushort uVar48;
  ushort uVar50;
  ushort uVar52;
  ushort uVar53;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  ulong uVar56;
  AES_state s;
  AES_state local_48;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  undefined6 uVar26;
  undefined1 auVar27 [14];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar29 [16];
  undefined1 auVar37 [16];
  
  local_48.slice[0] = 0;
  local_48.slice[1] = 0;
  local_48.slice[2] = 0;
  local_48.slice[3] = 0;
  local_48.slice[4] = 0;
  local_48.slice[5] = 0;
  local_48.slice[6] = 0;
  local_48.slice[7] = 0;
  lVar22 = ((ulong)out & 0xffffffff) * 0x10;
  puVar23 = in + lVar22;
  LoadBytes(&local_48,in_RCX);
  local_48.slice._0_8_ = *(ulong *)(in + lVar22) ^ local_48.slice._0_8_;
  local_48.slice._8_8_ = *(ulong *)((long)(in + lVar22) + 8) ^ local_48.slice._8_8_;
  if (1 < (int)out) {
    iVar20 = (int)out + -1;
    puVar21 = puVar23;
    do {
      puVar23 = puVar21 + -0x10;
      InvShiftRows(&local_48);
      SubBytes(&local_48,1);
      local_48.slice._0_8_ = *(ulong *)(puVar21 + -0x10) ^ local_48.slice._0_8_;
      local_48.slice._8_8_ = *(ulong *)(puVar21 + -8) ^ local_48.slice._8_8_;
      MixColumns(&local_48,1);
      iVar20 = iVar20 + -1;
      puVar21 = puVar23;
    } while (iVar20 != 0);
  }
  InvShiftRows(&local_48);
  SubBytes(&local_48,1);
  auVar18 = _DAT_006dc910;
  auVar17 = _DAT_006dc900;
  lVar22 = 0;
  do {
    local_48.slice[lVar22] = local_48.slice[lVar22] ^ *(ushort *)(puVar23 + lVar22 * 2 + -0x10);
    lVar22 = lVar22 + 1;
  } while (lVar22 != 8);
  iVar20 = 0;
  do {
    iVar19 = 0;
    do {
      auVar15._8_2_ = local_48.slice[4];
      auVar15._10_2_ = local_48.slice[5];
      auVar15._12_2_ = local_48.slice[6];
      auVar15._14_2_ = local_48.slice[7];
      auVar15._0_2_ = local_48.slice[0];
      auVar15._2_2_ = local_48.slice[1];
      auVar15._4_2_ = local_48.slice[2];
      auVar15._6_2_ = local_48.slice[3];
      auVar12._10_2_ = 0;
      auVar12._0_10_ = auVar15._0_10_;
      auVar12._12_2_ = local_48.slice[3];
      auVar13._8_2_ = local_48.slice[2];
      auVar13._0_2_ = local_48.slice[0];
      auVar13._2_2_ = local_48.slice[1];
      auVar13._4_2_ = local_48.slice[2];
      auVar13._6_2_ = local_48.slice[3];
      auVar13._10_4_ = auVar12._10_4_;
      auVar16._6_8_ = 0;
      auVar16._0_6_ = auVar13._8_6_;
      auVar14._4_2_ = local_48.slice[1];
      auVar14._0_4_ = local_48.slice._0_4_;
      auVar14._6_8_ = SUB148(auVar16 << 0x40,6);
      uVar56 = (ulong)(uint)(iVar20 + iVar19);
      auVar28._0_4_ = (local_48.slice._0_4_ & 0xffff) >> uVar56;
      auVar28._4_4_ = auVar14._4_4_ >> uVar56;
      auVar28._8_4_ = auVar13._8_4_ >> uVar56;
      auVar28._12_2_ = local_48.slice[3] >> uVar56;
      auVar28._14_2_ = 0;
      auVar54._2_2_ = 0;
      auVar54._0_2_ = local_48.slice[4] >> uVar56;
      auVar54._4_2_ = local_48.slice[5] >> uVar56;
      auVar54._6_2_ = 0;
      auVar54._8_2_ = local_48.slice[6] >> uVar56;
      auVar54._10_2_ = 0;
      auVar54._12_2_ = local_48.slice[7] >> uVar56;
      auVar54._14_2_ = 0;
      auVar54 = auVar54 & auVar17;
      auVar28 = auVar28 & auVar17;
      sVar7 = auVar28._0_2_;
      cVar1 = (0 < sVar7) * (sVar7 < 0x100) * auVar28[0] - (0xff < sVar7);
      sVar7 = auVar28._2_2_;
      sVar25 = CONCAT11((0 < sVar7) * (sVar7 < 0x100) * auVar28[2] - (0xff < sVar7),cVar1);
      sVar7 = auVar28._4_2_;
      cVar2 = (0 < sVar7) * (sVar7 < 0x100) * auVar28[4] - (0xff < sVar7);
      sVar7 = auVar28._6_2_;
      uVar44 = CONCAT13((0 < sVar7) * (sVar7 < 0x100) * auVar28[6] - (0xff < sVar7),
                        CONCAT12(cVar2,sVar25));
      sVar7 = auVar28._8_2_;
      cVar3 = (0 < sVar7) * (sVar7 < 0x100) * auVar28[8] - (0xff < sVar7);
      sVar7 = auVar28._10_2_;
      uVar26 = CONCAT15((0 < sVar7) * (sVar7 < 0x100) * auVar28[10] - (0xff < sVar7),
                        CONCAT14(cVar3,uVar44));
      sVar7 = auVar28._12_2_;
      cVar4 = (0 < sVar7) * (sVar7 < 0x100) * auVar28[0xc] - (0xff < sVar7);
      sVar7 = auVar28._14_2_;
      auVar27._0_8_ =
           CONCAT17((0 < sVar7) * (sVar7 < 0x100) * auVar28[0xe] - (0xff < sVar7),
                    CONCAT16(cVar4,uVar26));
      sVar7 = auVar54._0_2_;
      bVar24 = (0 < sVar7) * (sVar7 < 0x100) * auVar54[0] - (0xff < sVar7);
      auVar27[8] = bVar24;
      auVar27[9] = 0;
      sVar7 = auVar54._4_2_;
      bVar40 = (0 < sVar7) * (sVar7 < 0x100) * auVar54[4] - (0xff < sVar7);
      auVar27[10] = bVar40;
      auVar27[0xb] = 0;
      sVar7 = auVar54._8_2_;
      cVar5 = (0 < sVar7) * (sVar7 < 0x100) * auVar54[8] - (0xff < sVar7);
      auVar27[0xc] = cVar5;
      sVar7 = auVar54._10_2_;
      auVar27[0xd] = (0 < sVar7) * (sVar7 < 0x100) * auVar54[10] - (0xff < sVar7);
      sVar7 = auVar54._12_2_;
      cVar6 = (0 < sVar7) * (sVar7 < 0x100) * auVar54[0xc] - (0xff < sVar7);
      auVar29[0xe] = cVar6;
      auVar29._0_14_ = auVar27;
      sVar7 = auVar54._14_2_;
      auVar29[0xf] = (0 < sVar7) * (sVar7 < 0x100) * auVar54[0xe] - (0xff < sVar7);
      sVar7 = (short)((uint)uVar44 >> 0x10);
      auVar30[1] = (0 < sVar7) * (sVar7 < 0x100) * cVar2 - (0xff < sVar7);
      auVar30[0] = (0 < sVar25) * (sVar25 < 0x100) * cVar1 - (0xff < sVar25);
      sVar8 = (short)((uint6)uVar26 >> 0x20);
      auVar30[2] = (0 < sVar8) * (sVar8 < 0x100) * cVar3 - (0xff < sVar8);
      sVar9 = (short)((ulong)auVar27._0_8_ >> 0x30);
      auVar30[3] = (0 < sVar9) * (sVar9 < 0x100) * cVar4 - (0xff < sVar9);
      uVar41 = (ushort)bVar24;
      auVar30[4] = (bVar24 != 0) * (uVar41 < 0x100) * bVar24 - (0xff < uVar41);
      uVar43 = (ushort)bVar40;
      auVar30[5] = (bVar40 != 0) * (uVar43 < 0x100) * bVar40 - (0xff < uVar43);
      sVar10 = auVar27._12_2_;
      auVar30[6] = (0 < sVar10) * (sVar10 < 0x100) * cVar5 - (0xff < sVar10);
      sVar11 = auVar29._14_2_;
      auVar30[7] = (0 < sVar11) * (sVar11 < 0x100) * cVar6 - (0xff < sVar11);
      auVar30[8] = (0 < sVar25) * (sVar25 < 0x100) * cVar1 - (0xff < sVar25);
      auVar30[9] = (0 < sVar7) * (sVar7 < 0x100) * cVar2 - (0xff < sVar7);
      auVar30[10] = (0 < sVar8) * (sVar8 < 0x100) * cVar3 - (0xff < sVar8);
      auVar30[0xb] = (0 < sVar9) * (sVar9 < 0x100) * cVar4 - (0xff < sVar9);
      auVar30[0xc] = (bVar24 != 0) * (uVar41 < 0x100) * bVar24 - (0xff < uVar41);
      auVar30[0xd] = (bVar40 != 0) * (uVar43 < 0x100) * bVar40 - (0xff < uVar43);
      auVar30[0xe] = (0 < sVar10) * (sVar10 < 0x100) * cVar5 - (0xff < sVar10);
      auVar30[0xf] = (0 < sVar11) * (sVar11 < 0x100) * cVar6 - (0xff < sVar11);
      auVar30 = auVar30 & auVar18;
      auVar37._0_14_ = auVar30._0_14_;
      auVar37[0xe] = auVar30[7];
      auVar37[0xf] = auVar30[7];
      auVar36._14_2_ = auVar37._14_2_;
      auVar36._0_13_ = auVar30._0_13_;
      auVar36[0xd] = auVar30[6];
      auVar35._13_3_ = auVar36._13_3_;
      auVar35._0_12_ = auVar30._0_12_;
      auVar35[0xc] = auVar30[6];
      auVar34._12_4_ = auVar35._12_4_;
      auVar34._0_11_ = auVar30._0_11_;
      auVar34[0xb] = auVar30[5];
      auVar33._11_5_ = auVar34._11_5_;
      auVar33._0_10_ = auVar30._0_10_;
      auVar33[10] = auVar30[5];
      auVar32._10_6_ = auVar33._10_6_;
      auVar32._0_9_ = auVar30._0_9_;
      auVar32[9] = auVar30[4];
      auVar31._9_7_ = auVar32._9_7_;
      auVar31._0_8_ = auVar30._0_8_;
      auVar31[8] = auVar30[4];
      bVar24 = auVar30[0];
      bVar40 = auVar30[1] * '\x02';
      bVar42 = auVar30[2] * '\x04';
      bVar45 = auVar30[3] * '\b';
      uVar47 = auVar31._8_2_ * 0x10;
      uVar49 = auVar33._10_2_ * 0x20;
      uVar51 = auVar35._12_2_ * 0x40;
      uVar41 = (ushort)bVar40;
      uVar43 = (ushort)bVar42;
      uVar46 = (ushort)bVar45;
      uVar48 = uVar47 & 0xff;
      uVar50 = uVar49 & 0xff;
      uVar52 = uVar51 & 0xff;
      uVar53 = auVar36._14_2_ * 0x80 & 0xff;
      auVar38._0_8_ =
           CONCAT17((uVar53 != 0) * (uVar53 < 0x100) * (char)(auVar36._14_2_ * 0x80) -
                    (0xff < uVar53),
                    CONCAT16((uVar52 != 0) * (uVar52 < 0x100) * (char)uVar51 - (0xff < uVar52),
                             CONCAT15((uVar50 != 0) * (uVar50 < 0x100) * (char)uVar49 -
                                      (0xff < uVar50),
                                      CONCAT14((uVar48 != 0) * (uVar48 < 0x100) * (char)uVar47 -
                                               (0xff < uVar48),
                                               CONCAT13((uVar46 != 0) * (uVar46 < 0x100) * bVar45 -
                                                        (0xff < uVar46),
                                                        CONCAT12((uVar43 != 0) * (uVar43 < 0x100) *
                                                                 bVar42 - (0xff < uVar43),
                                                                 CONCAT11((uVar41 != 0) *
                                                                          (uVar41 < 0x100) * bVar40
                                                                          - (0xff < uVar41),
                                                                          (bVar24 != 0) *
                                                                          (bVar24 < 0x100) * bVar24
                                                                          - (0xff < bVar24))))))));
      auVar38._8_8_ = 0;
      uVar44 = (undefined4)(auVar38._0_8_ >> 0x20);
      auVar55._4_4_ = uVar44;
      auVar55._0_4_ = uVar44;
      auVar55._8_4_ = uVar44;
      auVar55._12_4_ = uVar44;
      auVar55 = auVar55 | auVar38;
      auVar39._0_4_ = auVar55._0_4_ >> 0x10;
      auVar39._4_4_ = 0;
      auVar39._8_4_ = auVar55._8_4_ >> 0x10;
      auVar39._12_4_ = auVar55._12_4_ >> 0x10;
      *(byte *)key->rd_key = SUB161(auVar39 | auVar55,1) | SUB161(auVar39 | auVar55,0);
      key = (AES_KEY *)((long)key->rd_key + 1);
      iVar19 = iVar19 + 4;
    } while (iVar19 != 0x10);
    iVar20 = iVar20 + 1;
  } while (iVar20 != 4);
  return;
}

Assistant:

static void AES_decrypt(const AES_state* rounds, int nrounds, unsigned char* plain16, const unsigned char* cipher16) {
    /* Most AES decryption implementations use the alternate scheme
     * (the Equivalent Inverse Cipher), which allows for more code reuse between
     * the encryption and decryption code, but requires separate setup for both.
     */
    AES_state s = {{0}};
    int round;

    rounds += nrounds;

    LoadBytes(&s, cipher16);
    AddRoundKey(&s, rounds--);

    for (round = 1; round < nrounds; round++) {
        InvShiftRows(&s);
        SubBytes(&s, 1);
        AddRoundKey(&s, rounds--);
        MixColumns(&s, 1);
    }

    InvShiftRows(&s);
    SubBytes(&s, 1);
    AddRoundKey(&s, rounds);

    SaveBytes(plain16, &s);
}